

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O1

void * __thiscall dgMeshEffect::GetFirstVertex(dgMeshEffect *this)

{
  dgTreeNode *this_00;
  dgRedBackNode *pdVar1;
  int iVar2;
  dgRedBackNode *pdVar3;
  
  this_00 = (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_head;
  if (this_00 == (dgTreeNode *)0x0) {
    pdVar1 = (dgRedBackNode *)0x0;
  }
  else {
    pdVar1 = dgRedBackNode::Minimum(&this_00->super_dgRedBackNode);
  }
  if (pdVar1 == (dgRedBackNode *)0x0) {
    pdVar1 = (dgRedBackNode *)0x0;
  }
  else {
    iVar2 = (this->super_dgPolyhedra).m_edgeMark + 1;
    (this->super_dgPolyhedra).m_edgeMark = iVar2;
    if (iVar2 == 0x7fffffff) {
      __assert_fail("m_edgeMark < 0x7fffffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.h"
                    ,0xe5,"hacd::HaI32 dgPolyhedra::IncLRU() const");
    }
    pdVar3 = pdVar1 + 1;
    do {
      *(int *)&pdVar3[1]._vptr_dgRedBackNode = iVar2;
      pdVar3 = *(dgRedBackNode **)(*(long *)&pdVar3->field_0x20 + 0x10);
    } while (pdVar3 != pdVar1 + 1);
  }
  return pdVar1;
}

Assistant:

void* dgMeshEffect::GetFirstVertex ()
{
	Iterator iter (*this);
	iter.Begin();

	dgTreeNode* node = NULL;
	if (iter) {
		hacd::HaI32 mark = IncLRU();
		node = iter.GetNode();

		dgEdge* const edge = &node->GetInfo();
		dgEdge* ptr = edge;
		do {
			ptr->m_mark = mark;
			ptr = ptr->m_twin->m_next;
		} while (ptr != edge);
	}
	return node; 
}